

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelEvent.cpp
# Opt level: O0

DataBuffer * __thiscall
MIDI::ChannelEvent::data(DataBuffer *__return_storage_ptr__,ChannelEvent *this,bool shorten)

{
  DataBuffer *__n;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar1;
  undefined1 extraout_DL_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar2;
  undefined7 extraout_var_01;
  byte typething;
  bool shorten_local;
  ChannelEvent *this_local;
  DataBuffer *data;
  
  __n = __return_storage_ptr__;
  Event::data(__return_storage_ptr__,&this->super_Event);
  uVar1 = extraout_DL;
  uVar2 = extraout_var;
  if (!shorten) {
    __n = (DataBuffer *)(ulong)(uint)this->_channel;
    DataBuffer::write(__return_storage_ptr__,
                      (uint)(byte)(this->_command * '\x10' + (char)this->_channel),
                      (void *)CONCAT71(extraout_var,extraout_DL),(size_t)__n);
    uVar1 = extraout_DL_00;
    uVar2 = extraout_var_00;
  }
  DataBuffer::write(__return_storage_ptr__,this->_param1 & 0xff,(void *)CONCAT71(uVar2,uVar1),
                    (size_t)__n);
  DataBuffer::write(__return_storage_ptr__,this->_param2 & 0xff,
                    (void *)CONCAT71(extraout_var_01,extraout_DL_01),(size_t)__n);
  return __return_storage_ptr__;
}

Assistant:

DataBuffer ChannelEvent::data(bool shorten)
  {
    DataBuffer data=Event::data();
    
    if(!shorten)
      {
	byte typething=_command;
	typething=(typething<<4);
	typething+=_channel;
	data.write(typething);
      }
    data.write(_param1);
    data.write(_param2);
    
    return data;
  }